

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool test9(void)

{
  int iVar1;
  bool bVar2;
  int c;
  queue<int> b;
  queue<int> a;
  
  srand(0);
  CP::queue<int>::queue(&a);
  CP::queue<int>::queue(&b);
  iVar1 = 100;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    c = rand();
    CP::queue<int>::push(&a,&c);
  }
  iVar1 = 500;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    c = rand();
    CP::queue<int>::push(&b,&c);
  }
  iVar1 = 9000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    c = rand();
    CP::queue<int>::push(&a,&c);
    CP::queue<int>::push(&b,&c);
  }
  iVar1 = 100;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    CP::queue<int>::pop(&a);
  }
  iVar1 = 500;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    CP::queue<int>::pop(&b);
  }
  iVar1 = 10;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    c = rand();
    CP::queue<int>::push(&a,&c);
  }
  iVar1 = 100;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    c = rand();
    CP::queue<int>::push(&b,&c);
  }
  bVar2 = CP::queue<int>::operator==(&a,&b);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    bVar2 = CP::queue<int>::operator==(&b,&a);
    bVar2 = !bVar2;
  }
  CP::queue<int>::~queue(&b);
  CP::queue<int>::~queue(&a);
  return bVar2;
}

Assistant:

bool test9() {
  srand(0);
  CP::queue<int> a,b;
  int f1 = 100;
  int f2 = 500;
  int same = 9000;
  int b1 = 10;
  int b2 = 100;
  for (int i = 0;i < f1;i++) a.push(rand());
  for (int i = 0;i < f2;i++) b.push(rand());
  for (int i = 0;i < same;i++) {
    int c = rand();
    a.push(c);
    b.push(c);
  }
  for (int i = 0;i < f1;i++) a.pop();
  for (int i = 0;i < f2;i++) b.pop();
  for (int i = 0;i < b1;i++) a.push(rand());
  for (int i = 0;i < b2;i++) b.push(rand());
  return ( ((a == b) == false)  && ((b == a) == false));
}